

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_address_hash.c
# Opt level: O3

void test_open_address_hashmap_update_2(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  ion_err_t iVar2;
  ion_status_t iVar3;
  char *pcVar4;
  ulong uVar5;
  char str [10];
  ion_hashmap_t map;
  uint local_78;
  char local_72 [10];
  ion_hashmap_t local_68;
  
  local_68.super.key_type = key_type_numeric_signed;
  local_68.super.compare = dictionary_compare_signed_value;
  oah_initialize(&local_68,oah_compute_simple_hash,key_type_numeric_signed,4,10,10);
  local_68.write_concern = '\x01';
  pVar1 = planck_unit_assert_true
                    (tc,1,0x2bd,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                     ,"condition was false, expected true");
  if (pVar1 != '\0') {
    local_78 = 0;
    if (1 < local_68.map_size) {
      uVar5 = 0;
      do {
        sprintf(local_72,"%02i is key",uVar5);
        iVar3 = oah_insert(&local_68,&local_78,local_72);
        pVar1 = planck_unit_assert_true
                          (tc,(uint)(iVar3.error == '\0'),0x2c6,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                           ,"condition was false, expected true");
        if (pVar1 == '\0') goto LAB_0010310d;
        pVar1 = planck_unit_assert_true
                          (tc,(uint)(((ulong)iVar3 & 0xffffffff00000000) == 0x100000000),0x2c7,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                           ,"condition was false, expected true");
        if (pVar1 == '\0') goto LAB_0010310d;
        local_78 = local_78 + 1;
        uVar5 = (ulong)local_78;
      } while ((int)local_78 < local_68.map_size / 2);
      local_78 = 0;
      if (1 < local_68.map_size) {
        do {
          pcVar4 = (char *)malloc(10);
          iVar3 = oah_get(&local_68,&local_78,pcVar4);
          pVar1 = planck_unit_assert_true
                            (tc,(uint)(iVar3.error == '\0'),0x2d0,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                             ,"condition was false, expected true");
          if (pVar1 == '\0') goto LAB_0010310d;
          pVar1 = planck_unit_assert_true
                            (tc,(uint)(((ulong)iVar3 & 0xffffffff00000000) == 0x100000000),0x2d1,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                             ,"condition was false, expected true");
          if (pVar1 == '\0') goto LAB_0010310d;
          sprintf(local_72,"%02i is key",(ulong)local_78);
          pVar1 = planck_unit_assert_str_are_equal
                            (tc,pcVar4,local_72,0x2d7,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                            );
          if (pVar1 == '\0') goto LAB_0010310d;
          if (pcVar4 != (char *)0x0) {
            free(pcVar4);
          }
          local_78 = local_78 + 1;
        } while ((int)local_78 < local_68.map_size / 2);
      }
    }
    local_78 = 0;
    if (0 < local_68.map_size) {
      uVar5 = 0;
      do {
        sprintf(local_72,"%02i is new",uVar5);
        iVar3 = oah_update(&local_68,&local_78,local_72);
        pVar1 = planck_unit_assert_true
                          (tc,(uint)(iVar3.error == '\0'),0x2e6,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                           ,"condition was false, expected true");
        if (pVar1 == '\0') goto LAB_0010310d;
        pVar1 = planck_unit_assert_true
                          (tc,(uint)(((ulong)iVar3 & 0xffffffff00000000) == 0x100000000),0x2e7,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                           ,"condition was false, expected true");
        if (pVar1 == '\0') goto LAB_0010310d;
        local_78 = local_78 + 1;
        uVar5 = (ulong)local_78;
      } while ((int)local_78 < local_68.map_size);
      local_78 = 0;
      if (0 < local_68.map_size) {
        do {
          pcVar4 = (char *)malloc(10);
          iVar3 = oah_get(&local_68,&local_78,pcVar4);
          pVar1 = planck_unit_assert_true
                            (tc,(uint)(iVar3.error == '\0'),0x2f0,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                             ,"condition was false, expected true");
          if (pVar1 == '\0') goto LAB_0010310d;
          pVar1 = planck_unit_assert_true
                            (tc,(uint)(((ulong)iVar3 & 0xffffffff00000000) == 0x100000000),0x2f1,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                             ,"condition was false, expected true");
          if (pVar1 == '\0') goto LAB_0010310d;
          sprintf(local_72,"%02i is new",(ulong)local_78);
          pVar1 = planck_unit_assert_str_are_equal
                            (tc,pcVar4,local_72,0x2f7,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                            );
          if (pVar1 == '\0') goto LAB_0010310d;
          if (pcVar4 != (char *)0x0) {
            free(pcVar4);
          }
          local_78 = local_78 + 1;
        } while ((int)local_78 < local_68.map_size);
      }
    }
    iVar2 = oah_destroy(&local_68);
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(iVar2 == '\0'),0x2fe,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                       ,"condition was false, expected true");
    if (pVar1 != '\0') {
      return;
    }
  }
LAB_0010310d:
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_open_address_hashmap_update_2(
	planck_unit_test_t *tc
) {
	ion_hashmap_t	map;							/* create handler for hashmap */
	int				i;
	ion_status_t	status;

	initialize_hash_map_std_conditions(&map);

	/* change write concern to allow up updates */
	map.write_concern = wc_insert_unique;

	/* check to make sure that the write concern is set to wc_insert_unique (default) */
	PLANCK_UNIT_ASSERT_TRUE(tc, wc_insert_unique == map.write_concern);

	/* populate the map to only half capacity to make sure there is room */
	for (i = 0; i < (map.map_size / 2); i++) {
		/* build up the value */
		char str[10];

		sprintf(str, "%02i is key", i);
		status = oah_insert(&map, (&i), str);
		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	}

	/* check status of <K,V> */
	for (i = 0; i < map.map_size / 2; i++) {
		ion_value_t value;

		value	= malloc(10);
		status	= oah_get(&map, &i, value);
		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);

		/* build up expected value */
		char str[10];

		sprintf(str, "%02i is key", i);
		PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) value, str);

		if (value != NULL) {
			/* must free value after query */
			free(value);
		}
	}

	/*and update the values for the known keys */
	for (i = 0; i < (map.map_size); i++) {
		/* build up the value */
		char str[10];

		sprintf(str, "%02i is new", i);
		status = oah_update(&map, (&i), str);
		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	}

	/* and check updated status of <K,V> */
	for (i = 0; i < map.map_size; i++) {
		ion_value_t value;

		value	= malloc(10);
		status	= oah_get(&map, &i, value);
		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);

		/* build up expected value */
		char str[10];

		sprintf(str, "%02i is new", i);
		PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) value, str);

		if (value != NULL) {
			free(value);
		}	/* must free value after query */
	}

	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == oah_destroy(&map));
}